

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_cvc.c
# Opt level: O1

err_t cmdCVCsCreate(octet *certs,size_t *certs_len,char *descr)

{
  bool bVar1;
  err_t eVar2;
  err_t eVar3;
  size_t sVar4;
  long lVar5;
  char **argv;
  int argc;
  size_t size;
  char **local_48;
  int local_3c;
  size_t local_38;
  
  eVar2 = cmdArgCreate(&local_3c,&local_48,descr);
  if (eVar2 == 0) {
    if (local_3c < 1) {
      eVar2 = 0;
      sVar4 = 0;
    }
    else {
      lVar5 = 0;
      sVar4 = 0;
      eVar3 = 0;
      do {
        local_38 = cmdFileSize(local_48[lVar5]);
        if (local_38 == 0xffffffffffffffff) {
          cmdArgClose(local_48);
          eVar3 = 0xcf;
          bVar1 = false;
          eVar2 = 0xcf;
        }
        else if (certs == (octet *)0x0) {
LAB_001038c1:
          sVar4 = sVar4 + local_38;
          bVar1 = true;
          eVar2 = 0;
        }
        else if (*certs_len < local_38 + sVar4) {
          cmdArgClose(local_48);
          bVar1 = false;
          eVar2 = 0x6e;
          eVar3 = 0x6e;
        }
        else {
          eVar2 = cmdFileReadAll(certs + sVar4,&local_38,local_48[lVar5]);
          if (eVar2 == 0) goto LAB_001038c1;
          cmdArgClose(local_48);
          bVar1 = false;
          eVar3 = eVar2;
        }
        if (!bVar1) {
          return eVar3;
        }
        lVar5 = lVar5 + 1;
      } while (lVar5 < local_3c);
    }
    cmdArgClose(local_48);
    *certs_len = sVar4;
  }
  return eVar2;
}

Assistant:

err_t cmdCVCsCreate(octet* certs, size_t* certs_len, const char* descr)
{
	err_t code;
	int argc;
	char** argv;
	int pos;
	size_t len;
	// pre
	ASSERT(memIsValid(certs_len, O_PER_S));
	ASSERT(memIsNullOrValid(certs, *certs_len));
	ASSERT(strIsValid(descr));
	// создать список файлов сертификатов
	code = cmdArgCreate(&argc, &argv, descr);
	ERR_CALL_CHECK(code);
	// просмотреть список
	len = 0;
	for (pos = 0; pos < argc; ++pos)
	{
		size_t size;
		// определить размер файла
		size = cmdFileSize(argv[pos]);
		code = size != SIZE_MAX ? ERR_OK : ERR_FILE_READ;
		ERR_CALL_HANDLE(code, cmdArgClose(argv));
		// режим чтения?
		if (certs)
		{
			// выход за границы?
			code = len + size <= *certs_len ? ERR_OK : ERR_OUTOFMEMORY;
			ERR_CALL_HANDLE(code, cmdArgClose(argv));
			// читать сертификат
			code = cmdFileReadAll(certs + len, &size, argv[pos]);
			ERR_CALL_HANDLE(code, cmdArgClose(argv));
		}
		// увеличить длину коллекции
		len += size;
	}
	cmdArgClose(argv);
	// завершить
	*certs_len = len;
	return code;
}